

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void SequenceSpanTask::convert_bio_to_bilou(multi_ex *ec)

{
  uint uVar1;
  pointer ppeVar2;
  size_t n;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  
  n = 0;
  while( true ) {
    ppeVar2 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3;
    if (uVar4 <= n) break;
    uVar5 = 0;
    if (n != uVar4 - 1) {
      uVar5 = (ppeVar2[n + 1]->l).multi.label;
    }
    uVar1 = (ppeVar2[n]->l).multi.label;
    if (uVar1 != 1) {
      if ((uVar1 & 1) == 0) {
        if (uVar5 == (uVar1 | 1)) {
          uVar3 = uVar1 * 2 - 1;
        }
        else {
          uVar3 = uVar1 * 2 - 2;
        }
      }
      else if (uVar5 == uVar1) {
        uVar3 = uVar1 * 2 - 2;
      }
      else {
        uVar3 = uVar1 * 2 - 1;
      }
      (ppeVar2[n]->l).multi.label = uVar3;
    }
    n = n + 1;
  }
  return;
}

Assistant:

void convert_bio_to_bilou(multi_ex& ec)
{
  for (size_t n = 0; n < ec.size(); n++)
  {
    MULTICLASS::label_t& ylab = ec[n]->l.multi;
    action y = ylab.label;
    action nexty = (n == ec.size() - 1) ? 0 : ec[n + 1]->l.multi.label;
    if (y == 1)  // do nothing
      ;
    else if (y % 2 == 0)  // this is a begin-X
    {
      if (nexty != y + 1)                  // should be unit
        ylab.label = (y / 2 - 1) * 4 + 2;  // from 2 to 2, 4 to 6, 6 to 10, etc.
      else                                 // should be begin-X
        ylab.label = (y / 2 - 1) * 4 + 3;  // from 2 to 3, 4 to 7, 6 to 11, etc.
    }
    else if (y % 2 == 1)  // this is an in-X
    {
      if (nexty != y)                  // should be last
        ylab.label = (y - 1) * 2 + 1;  // from 3 to 5, 5 to 9, 7 to 13, etc.
      else                             // should be in-X
        ylab.label = (y - 1) * 2;      // from 3 to 4, 5 to 8, 7 to 12, etc.
    }
    assert(y == bilou_to_bio(ylab.label));
  }
}